

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O2

FileBufSlot * read_ivf_file(FileReader data)

{
  FILE *__stream;
  int iVar1;
  RK_U32 RVar2;
  size_t sVar3;
  FileBufSlot *pFVar4;
  long lVar5;
  size_t __n;
  RK_U8 ivf_data [12];
  
  ivf_data[8] = '\0';
  ivf_data[9] = '\0';
  ivf_data[10] = '\0';
  ivf_data[0xb] = '\0';
  ivf_data[0] = '\0';
  ivf_data[1] = '\0';
  ivf_data[2] = '\0';
  ivf_data[3] = '\0';
  ivf_data[4] = '\0';
  ivf_data[5] = '\0';
  ivf_data[6] = '\0';
  ivf_data[7] = '\0';
  __stream = *data;
  sVar3 = fread(ivf_data,1,0xc,__stream);
  if (sVar3 != 0xc) {
    pFVar4 = (FileBufSlot *)mpp_osal_calloc("read_ivf_file",0x28);
    RVar2 = 1;
    goto LAB_001074c7;
  }
  *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + 0xc;
  __n = (size_t)(int)ivf_data._0_4_;
  pFVar4 = (FileBufSlot *)mpp_osal_malloc("read_ivf_file",__n + 0x1027 & 0xfffffffffffff000);
  pFVar4->data = (char *)(pFVar4 + 1);
  sVar3 = fread(pFVar4 + 1,1,__n,__stream);
  *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + sVar3;
  *(size_t *)((long)data + 0x48) = sVar3;
  if (__n == 0) {
    lVar5 = ftell(__stream);
    _mpp_log_l(2,"mpi_dec_utils","data_size is zero! ftell size %d\n",0,lVar5);
LAB_001074bb:
    RVar2 = 1;
  }
  else if (((sVar3 != __n) || (iVar1 = feof(__stream), iVar1 != 0)) ||
          (RVar2 = 0, *(ulong *)((long)data + 8) <= *(ulong *)((long)data + 0x40)))
  goto LAB_001074bb;
  pFVar4->buf = (MppBuffer)0x0;
  pFVar4->size = sVar3;
LAB_001074c7:
  pFVar4->eos = RVar2;
  return pFVar4;
}

Assistant:

static FileBufSlot *read_ivf_file(FileReader data)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;
    RK_U8 ivf_data[IVF_FRAME_HEADER_LENGTH] = {0};
    size_t ivf_data_size = IVF_FRAME_HEADER_LENGTH;
    FILE *fp = impl->fp_input;
    FileBufSlot *slot = NULL;
    size_t data_size = 0;
    size_t read_size = 0;
    RK_U32 eos = 0;

    if (fread(ivf_data, 1, ivf_data_size, fp) != ivf_data_size) {
        /* end of frame queue */
        slot = mpp_calloc(FileBufSlot, 1);
        slot->eos = 1;

        return slot;
    }

    impl->read_total += ivf_data_size;
    data_size = ivf_data[0] | (ivf_data[1] << 8) | (ivf_data[2] << 16) | (ivf_data[3] << 24);
    slot = mpp_malloc_size(FileBufSlot, MPP_ALIGN(sizeof(FileBufSlot) + data_size, SZ_4K));
    slot->data = (char *)(slot + 1);
    read_size = fread(slot->data, 1, data_size, fp);
    impl->read_total += read_size;
    impl->read_size = read_size;

    if (!data_size)
        mpp_err("data_size is zero! ftell size %d\n", ftell(fp));
    /* check reach eos whether or not */
    if (!data_size || read_size != data_size || feof(fp) || impl->read_total >= impl->file_size)
        eos = 1;

    slot->buf = NULL;
    slot->size = read_size;
    slot->eos = eos;

    return slot;
}